

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LE_Detonation_PDU.cpp
# Opt level: O1

void __thiscall KDIS::PDU::LE_Detonation_PDU::Encode(LE_Detonation_PDU *this,KDataStream *stream)

{
  LE_EntityIdentifier *pLVar1;
  MunitionDescriptor *this_00;
  KUINT16 KVar2;
  WarheadType WVar3;
  FuseType FVar4;
  EntityType *pEVar5;
  
  checkFlagsAndPDULength(this);
  LE_Header::Encode(&this->super_LE_Header,stream);
  KDataStream::Write(stream,(this->m_DetonationFlag1Union).m_ui8Flag);
  if ((char)(this->m_DetonationFlag1Union).m_ui8Flag < '\0') {
    KDataStream::Write(stream,(this->m_DetonationFlag2Union).m_ui8Flag);
  }
  if (((this->m_DetonationFlag1Union).m_ui8Flag & 1) != 0) {
    (*(this->m_TargetID).super_DataTypeBase._vptr_DataTypeBase[5])(&this->m_TargetID,stream);
  }
  if (((this->m_DetonationFlag1Union).m_ui8Flag & 4) != 0) {
    pLVar1 = &this->m_MunitionID;
    if (((this->m_DetonationFlag1Union).m_ui8Flag & 2) == 0) {
      KVar2 = DATA_TYPE::LE_EntityIdentifier::GetEntityID(pLVar1);
      KDataStream::Write<unsigned_short>(stream,KVar2);
    }
    else {
      (*(pLVar1->super_DataTypeBase)._vptr_DataTypeBase[5])(pLVar1,stream);
    }
  }
  if (((this->m_DetonationFlag2Union).m_ui8Flag & 2) != 0) {
    pLVar1 = &this->m_EventID;
    if (((this->m_DetonationFlag1Union).m_ui8Flag & 8) == 0) {
      KVar2 = DATA_TYPE::LE_EntityIdentifier::GetEntityID(pLVar1);
      KDataStream::Write<unsigned_short>(stream,KVar2);
    }
    else {
      (*(pLVar1->super_DataTypeBase)._vptr_DataTypeBase[5])(pLVar1,stream);
    }
  }
  if (((this->m_DetonationFlag1Union).m_ui8Flag & 0x40) == 0) {
    (*(this->m_LocWrldCoord).super_DataTypeBase._vptr_DataTypeBase[5])(&this->m_LocWrldCoord,stream)
    ;
  }
  (*(this->m_Vel).super_DataTypeBase._vptr_DataTypeBase[5])(&this->m_Vel,stream);
  if (((this->m_DetonationFlag2Union).m_ui8Flag & 1) != 0) {
    (*(this->m_Ori).super_DataTypeBase._vptr_DataTypeBase[5])(&this->m_Ori,stream);
  }
  this_00 = &this->m_MunitionDesc;
  pEVar5 = DATA_TYPE::Descriptor::GetType(&this_00->super_Descriptor);
  (*(pEVar5->super_DataTypeBase)._vptr_DataTypeBase[5])(pEVar5,stream);
  if (((this->m_DetonationFlag1Union).m_ui8Flag & 0x10) != 0) {
    WVar3 = DATA_TYPE::MunitionDescriptor::GetWarhead(this_00);
    KDataStream::Write<unsigned_short>(stream,(unsigned_short)WVar3);
    FVar4 = DATA_TYPE::MunitionDescriptor::GetFuse(this_00);
    KDataStream::Write<unsigned_short>(stream,(unsigned_short)FVar4);
  }
  if (((this->m_DetonationFlag1Union).m_ui8Flag & 0x20) != 0) {
    KVar2 = DATA_TYPE::MunitionDescriptor::GetQuantity(this_00);
    KDataStream::Write<unsigned_short>(stream,KVar2);
    KVar2 = DATA_TYPE::MunitionDescriptor::GetRate(this_00);
    KDataStream::Write<unsigned_short>(stream,KVar2);
  }
  if (((this->m_DetonationFlag1Union).m_ui8Flag & 0x40) != 0) {
    (*(this->m_LocEntCoord).super_DataTypeBase._vptr_DataTypeBase[5])(&this->m_LocEntCoord,stream);
  }
  KDataStream::Write(stream,this->m_ui8DetonationResult);
  KVar2 = KDataStream::GetBufferSize(stream);
  if (KVar2 == (this->super_LE_Header).super_Header.super_Header6.m_ui16PDULength) {
    return;
  }
  __assert_fail("stream.GetBufferSize() == m_ui16PDULength",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/jarvisfriends[P]KDIS/KDIS/PDU/Live_Entity/LE_Detonation_PDU.cpp"
                ,0x39e,"virtual void KDIS::PDU::LE_Detonation_PDU::Encode(KDataStream &) const");
}

Assistant:

void LE_Detonation_PDU::Encode( KDataStream & stream ) const
{
    // We need to cast away the const so we can check the flag values are correct
    // Must check the flags before encoding the header since PDU length may change
    LE_Detonation_PDU * self = const_cast<LE_Detonation_PDU*>( this );
    self->checkFlagsAndPDULength();

    LE_Header::Encode( stream );

    stream << m_DetonationFlag1Union.m_ui8Flag;

    // F7: Flag Octet 2
    if( m_DetonationFlag1Union.m_ui8Flag2 )
    {
        stream << m_DetonationFlag2Union.m_ui8Flag;
    }

    // F0: Target Entity ID
    if( m_DetonationFlag1Union.m_ui8TargetId )
    {
        stream << KDIS_STREAM m_TargetID;
    }

    // F2: Munition ID
    if( m_DetonationFlag1Union.m_ui8MunitionId )
    {
        // F1: Site Number and Application Number
        if( m_DetonationFlag1Union.m_ui8MunitionSiteApp )
        {
            stream << KDIS_STREAM m_MunitionID;
        }
        else
        {
            // We cant use the standard encode/decode functions here as not all fields are included.
            stream << m_MunitionID.GetEntityID();
        }
    }

    // G1: Event Number
    if( m_DetonationFlag2Union.m_ui8EventNum )
    {
        // F3: Event ID
        if( m_DetonationFlag1Union.m_ui8EventSiteAppId )
        {
            stream << KDIS_STREAM m_EventID;
        }
        else
        {
            // We cant use the standard encode/decode functions here as not all fields are included.
            stream << m_EventID.GetEntityID();
        }
    }

    // F6: Is the location in world coordinates?
    if( !m_DetonationFlag1Union.m_ui8LocationTyp ) // false means location is in world coords
    {
        stream << KDIS_STREAM m_LocWrldCoord;
    }

    // Velocity
    stream << KDIS_STREAM m_Vel;

    // G0: Munition Orientation
    if( m_DetonationFlag2Union.m_ui8MunitionOri )
    {
        stream << KDIS_STREAM m_Ori;
    }

    // Munition Descriptor
    stream << KDIS_STREAM m_MunitionDesc.GetType();
    // F4: Warhead and Fuse fields of the Munition Descriptor record
    if( m_DetonationFlag1Union.m_ui8WarheadFuse )
    {
        stream << ( KUINT16 )m_MunitionDesc.GetWarhead()
               << ( KUINT16 )m_MunitionDesc.GetFuse();
    }
    // F5: Quantity and Rate fields of the Munition Descriptor record
    if( m_DetonationFlag1Union.m_ui8QuantRate )
    {
        stream << m_MunitionDesc.GetQuantity()
               << m_MunitionDesc.GetRate();
    }

    // Is the location in entity coordinates?
    if( m_DetonationFlag1Union.m_ui8LocationTyp ) // true means location is in entity coords
    {
        stream << KDIS_STREAM m_LocEntCoord;
    }

    // Detonation Result
    stream << m_ui8DetonationResult;

    assert(stream.GetBufferSize() == m_ui16PDULength);
}